

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_buffer_access.cpp
# Opt level: O2

void __thiscall
lower_buffer_access::lower_buffer_access::setup_buffer_access
          (lower_buffer_access *this,void *mem_ctx,ir_rvalue *deref,ir_rvalue **offset,
          uint *const_offset,bool *row_major,glsl_type **matrix_type,
          glsl_struct_field **struct_field,glsl_interface_packing packing)

{
  ushort uVar1;
  int iVar2;
  _func_int *p_Var3;
  operand a;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  ir_constant *this_00;
  ir_dereference_record *this_01;
  ulong uVar7;
  glsl_type *pgVar8;
  glsl_type *pgVar9;
  operand oVar10;
  undefined4 extraout_var;
  operand b;
  ir_expression *piVar11;
  ulong uVar12;
  long lVar13;
  ir_constant *this_02;
  ir_dereference_record *this_03;
  uint uVar14;
  int iVar15;
  ir_rvalue *local_60;
  
  this_00 = (ir_constant *)exec_node::operator_new(0xb0,mem_ctx);
  this_02 = this_00;
  ir_constant::ir_constant(this_00,0,1);
  *offset = (ir_rvalue *)this_00;
  bVar4 = is_dereferenced_thing_row_major((lower_buffer_access *)this_02,deref);
  *row_major = bVar4;
  *matrix_type = (glsl_type *)0x0;
switchD_001e132e_caseD_2:
  local_60 = deref;
  if (local_60 == (ir_rvalue *)0x0) {
    return;
  }
  deref = (ir_rvalue *)0x0;
  switch((local_60->super_ir_instruction).ir_type) {
  case ir_type_dereference_array:
    bVar4 = glsl_type::is_vector
                      ((glsl_type *)local_60[1].super_ir_instruction._vptr_ir_instruction[4]);
    pgVar8 = (glsl_type *)local_60[1].super_ir_instruction._vptr_ir_instruction[4];
    if (bVar4) {
      bVar5 = pgVar8->field_0x4 - 4;
      uVar6 = 4;
      if (bVar5 < 10) {
        uVar6 = *(uint *)(&DAT_0021d7f8 + (ulong)bVar5 * 4);
      }
    }
    else if (((*(uint *)&pgVar8->field_0x4 & 0xff) - 2 < 3 && 1 < pgVar8->matrix_columns) &&
            (*row_major == true)) {
      bVar5 = (char)*(uint *)&pgVar8->field_0x4 - 4;
      uVar6 = 4;
      if (bVar5 < 10) {
        uVar6 = *(uint *)(&DAT_0021d7f8 + (ulong)bVar5 * 4);
      }
      *matrix_type = pgVar8;
    }
    else {
      pgVar8 = local_60->type;
      pgVar9 = glsl_type::without_array(pgVar8);
      if (pgVar9->field_0x4 == '\x10') break;
      bVar4 = is_dereferenced_thing_row_major((lower_buffer_access *)pgVar8,local_60);
      if (packing == GLSL_INTERFACE_PACKING_STD430) {
        uVar6 = glsl_type::std430_array_stride(local_60->type,bVar4);
      }
      else {
        uVar6 = glsl_type::std140_size(local_60->type,bVar4);
        uVar6 = uVar6 + 0xf & 0xfffffff0;
      }
    }
    oVar10.val = (ir_rvalue *)local_60[1].super_ir_instruction.super_exec_node.next;
    if ((oVar10.val)->type->field_0x4 == '\x01') {
      oVar10.val = &ir_builder::i2u(oVar10)->super_ir_rvalue;
    }
    iVar15 = (*((oVar10.val)->super_ir_instruction)._vptr_ir_instruction[6])(oVar10.val,mem_ctx,0);
    if (CONCAT44(extraout_var,iVar15) == 0) {
      a.val = *offset;
      b.val = (ir_rvalue *)exec_node::operator_new(0xb0,mem_ctx);
      ir_constant::ir_constant((ir_constant *)b.val,uVar6,1);
      oVar10.val = &ir_builder::mul(oVar10,b)->super_ir_rvalue;
      piVar11 = ir_builder::add(a,oVar10);
      *offset = &piVar11->super_ir_rvalue;
    }
    else {
      *const_offset = *const_offset + uVar6 * *(int *)(CONCAT44(extraout_var,iVar15) + 0x28);
    }
    break;
  case ir_type_dereference_record:
    p_Var3 = local_60[1].super_ir_instruction._vptr_ir_instruction[4];
    lVar13 = 0;
    iVar15 = 0;
    for (uVar12 = 0; uVar12 < *(uint *)(p_Var3 + 0xc); uVar12 = uVar12 + 1) {
      pgVar8 = *(glsl_type **)(*(long *)(p_Var3 + 0x20) + lVar13);
      this_01 = (ir_dereference_record *)exec_node::operator_new(0x38,mem_ctx);
      this_03 = this_01;
      ir_dereference_record::ir_dereference_record
                (this_01,(ir_rvalue *)local_60[1].super_ir_instruction._vptr_ir_instruction,
                 *(char **)(*(long *)(p_Var3 + 0x20) + 8 + lVar13));
      bVar4 = is_dereferenced_thing_row_major((lower_buffer_access *)this_03,(ir_rvalue *)this_01);
      ralloc_free(this_01);
      if (packing == GLSL_INTERFACE_PACKING_STD430) {
        uVar6 = glsl_type::std430_base_alignment(pgVar8,bVar4);
      }
      else {
        uVar6 = glsl_type::std140_base_alignment(pgVar8,bVar4);
      }
      iVar2 = *(int *)(*(long *)(p_Var3 + 0x20) + 0x14 + lVar13);
      if (iVar2 != -1) {
        iVar15 = iVar2;
      }
      uVar14 = (uVar6 + iVar15) - 1;
      uVar7 = (ulong)*(int *)&local_60[1].super_ir_instruction.super_exec_node.next;
      if ((long)uVar7 < 0) {
        __assert_fail("deref_record->field_idx >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_buffer_access.cpp"
                      ,0x18e,
                      "void lower_buffer_access::lower_buffer_access::setup_buffer_access(void *, ir_rvalue *, ir_rvalue **, unsigned int *, bool *, const glsl_type **, const glsl_struct_field **, enum glsl_interface_packing)"
                     );
      }
      iVar15 = uVar14 - uVar14 % uVar6;
      if (uVar12 == uVar7) {
        if (struct_field != (glsl_struct_field **)0x0) {
          *struct_field = (glsl_struct_field *)(*(long *)(p_Var3 + 0x20) + lVar13);
        }
        break;
      }
      if (packing == GLSL_INTERFACE_PACKING_STD430) {
        uVar14 = glsl_type::std430_size(pgVar8,bVar4);
      }
      else {
        uVar14 = glsl_type::std140_size(pgVar8,bVar4);
      }
      iVar15 = uVar14 + iVar15;
      pgVar8 = glsl_type::without_array(pgVar8);
      if (pgVar8->field_0x4 == '\x0f') {
        uVar14 = (uVar6 - 1) + iVar15;
        iVar15 = uVar14 - uVar14 % uVar6;
      }
      lVar13 = lVar13 + 0x30;
    }
    *const_offset = *const_offset + iVar15;
    break;
  case ir_type_dereference_variable:
    goto switchD_001e132e_caseD_2;
  default:
    goto switchD_001e132e_caseD_3;
  case ir_type_swizzle:
    uVar1 = *(ushort *)&local_60[1].super_ir_instruction.super_exec_node.next;
    if ((uVar1 & 0x700) != 0x100) {
      __assert_fail("deref_swizzle->mask.num_components == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_buffer_access.cpp"
                    ,0x1b0,
                    "void lower_buffer_access::lower_buffer_access::setup_buffer_access(void *, ir_rvalue *, ir_rvalue **, unsigned int *, bool *, const glsl_type **, const glsl_struct_field **, enum glsl_interface_packing)"
                   );
    }
    *const_offset = *const_offset + (uVar1 & 3) * 4;
  }
  local_60 = local_60 + 1;
  deref = (ir_rvalue *)(local_60->super_ir_instruction)._vptr_ir_instruction;
  if (ir_type_dereference_variable < (deref->super_ir_instruction).ir_type) {
    deref = (ir_rvalue *)0x0;
  }
  goto switchD_001e132e_caseD_2;
switchD_001e132e_caseD_3:
  __assert_fail("!\"not reached\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_buffer_access.cpp"
                ,0x1b8,
                "void lower_buffer_access::lower_buffer_access::setup_buffer_access(void *, ir_rvalue *, ir_rvalue **, unsigned int *, bool *, const glsl_type **, const glsl_struct_field **, enum glsl_interface_packing)"
               );
}

Assistant:

void
lower_buffer_access::setup_buffer_access(void *mem_ctx,
                                         ir_rvalue *deref,
                                         ir_rvalue **offset,
                                         unsigned *const_offset,
                                         bool *row_major,
                                         const glsl_type **matrix_type,
                                         const glsl_struct_field **struct_field,
                                         enum glsl_interface_packing packing)
{
   *offset = new(mem_ctx) ir_constant(0u);
   *row_major = is_dereferenced_thing_row_major(deref);
   *matrix_type = NULL;

   /* Calculate the offset to the start of the region of the UBO
    * dereferenced by *rvalue.  This may be a variable offset if an
    * array dereference has a variable index.
    */
   while (deref) {
      switch (deref->ir_type) {
      case ir_type_dereference_variable: {
         deref = NULL;
         break;
      }

      case ir_type_dereference_array: {
         ir_dereference_array *deref_array = (ir_dereference_array *) deref;
         unsigned array_stride;
         if (deref_array->array->type->is_vector()) {
            /* We get this when storing or loading a component out of a vector
             * with a non-constant index. This happens for v[i] = f where v is
             * a vector (or m[i][j] = f where m is a matrix). If we don't
             * lower that here, it gets turned into v = vector_insert(v, i,
             * f), which loads the entire vector, modifies one component and
             * then write the entire thing back.  That breaks if another
             * thread or SIMD channel is modifying the same vector.
             */
            array_stride = 4;
            if (deref_array->array->type->is_64bit())
               array_stride *= 2;
         } else if (deref_array->array->type->is_matrix() && *row_major) {
            /* When loading a vector out of a row major matrix, the
             * step between the columns (vectors) is the size of a
             * float, while the step between the rows (elements of a
             * vector) is handled below in emit_ubo_loads.
             */
            array_stride = 4;
            if (deref_array->array->type->is_64bit())
               array_stride *= 2;
            *matrix_type = deref_array->array->type;
         } else if (deref_array->type->without_array()->is_interface()) {
            /* We're processing an array dereference of an interface instance
             * array. The thing being dereferenced *must* be a variable
             * dereference because interfaces cannot be embedded in other
             * types. In terms of calculating the offsets for the lowering
             * pass, we don't care about the array index. All elements of an
             * interface instance array will have the same offsets relative to
             * the base of the block that backs them.
             */
            deref = deref_array->array->as_dereference();
            break;
         } else {
            /* Whether or not the field is row-major (because it might be a
             * bvec2 or something) does not affect the array itself. We need
             * to know whether an array element in its entirety is row-major.
             */
            const bool array_row_major =
               is_dereferenced_thing_row_major(deref_array);

            /* The array type will give the correct interface packing
             * information
             */
            if (packing == GLSL_INTERFACE_PACKING_STD430) {
               array_stride = deref_array->type->std430_array_stride(array_row_major);
            } else {
               array_stride = deref_array->type->std140_size(array_row_major);
               array_stride = glsl_align(array_stride, 16);
            }
         }

         ir_rvalue *array_index = deref_array->array_index;
         if (array_index->type->base_type == GLSL_TYPE_INT)
            array_index = i2u(array_index);

         ir_constant *const_index =
            array_index->constant_expression_value(mem_ctx, NULL);
         if (const_index) {
            *const_offset += array_stride * const_index->value.u[0];
         } else {
            *offset = add(*offset,
                          mul(array_index,
                              new(mem_ctx) ir_constant(array_stride)));
         }
         deref = deref_array->array->as_dereference();
         break;
      }

      case ir_type_dereference_record: {
         ir_dereference_record *deref_record = (ir_dereference_record *) deref;
         const glsl_type *struct_type = deref_record->record->type;
         unsigned intra_struct_offset = 0;

         for (unsigned int i = 0; i < struct_type->length; i++) {
            const glsl_type *type = struct_type->fields.structure[i].type;

            ir_dereference_record *field_deref = new(mem_ctx)
               ir_dereference_record(deref_record->record,
                                     struct_type->fields.structure[i].name);
            const bool field_row_major =
               is_dereferenced_thing_row_major(field_deref);

            ralloc_free(field_deref);

            unsigned field_align = 0;

            if (packing == GLSL_INTERFACE_PACKING_STD430)
               field_align = type->std430_base_alignment(field_row_major);
            else
               field_align = type->std140_base_alignment(field_row_major);

            if (struct_type->fields.structure[i].offset != -1) {
               intra_struct_offset = struct_type->fields.structure[i].offset;
            }

            intra_struct_offset = glsl_align(intra_struct_offset, field_align);

            assert(deref_record->field_idx >= 0);
            if (i == (unsigned) deref_record->field_idx) {
               if (struct_field)
                  *struct_field = &struct_type->fields.structure[i];
               break;
            }

            if (packing == GLSL_INTERFACE_PACKING_STD430)
               intra_struct_offset += type->std430_size(field_row_major);
            else
               intra_struct_offset += type->std140_size(field_row_major);

            /* If the field just examined was itself a structure, apply rule
             * #9:
             *
             *     "The structure may have padding at the end; the base offset
             *     of the member following the sub-structure is rounded up to
             *     the next multiple of the base alignment of the structure."
             */
            if (type->without_array()->is_struct()) {
               intra_struct_offset = glsl_align(intra_struct_offset,
                                                field_align);

            }
         }

         *const_offset += intra_struct_offset;
         deref = deref_record->record->as_dereference();
         break;
      }

      case ir_type_swizzle: {
         ir_swizzle *deref_swizzle = (ir_swizzle *) deref;

         assert(deref_swizzle->mask.num_components == 1);

         *const_offset += deref_swizzle->mask.x * sizeof(int);
         deref = deref_swizzle->val->as_dereference();
         break;
      }

      default:
         assert(!"not reached");
         deref = NULL;
         break;
      }
   }
}